

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O2

int anon_unknown.dwarf_ae93::CheckHeader(FILE *fp)

{
  int iVar1;
  undefined8 in_RAX;
  char *__s;
  char data_check [5];
  undefined3 uStack_23;
  
  _data_check = in_RAX;
  fread(data_check,1,4,(FILE *)fp);
  data_check = (char  [5])CONCAT14('\0',data_check._0_4_);
  iVar1 = bcmp(data_check,"RIFF",5);
  if (iVar1 == 0) {
    fseek((FILE *)fp,4,1);
    fread(data_check,1,4,(FILE *)fp);
    iVar1 = bcmp(data_check,"WAVE",5);
    if (iVar1 == 0) {
      fread(data_check,1,4,(FILE *)fp);
      iVar1 = bcmp(data_check,"fmt ",5);
      if (iVar1 == 0) {
        fread(data_check,1,4,(FILE *)fp);
        if (data_check._0_4_ == 0x10) {
          fread(data_check,1,2,(FILE *)fp);
          __s = "Format ID error.";
          if ((data_check[0] == '\x01') && (data_check[1] == '\0')) {
            fread(data_check,1,2,(FILE *)fp);
            __s = "This function cannot support stereo file";
            if ((data_check[0] == '\x01') && (data_check[1] == '\0')) {
              return 1;
            }
          }
        }
        else {
          __s = "fmt (2) error.";
        }
      }
      else {
        __s = "fmt error.";
      }
    }
    else {
      __s = "WAVE error.";
    }
  }
  else {
    __s = "RIFF error.";
  }
  puts(__s);
  return 0;
}

Assistant:

static int CheckHeader(FILE *fp) {
  char data_check[5];
  fread(data_check, 1, 4, fp);  // "RIFF"
  data_check[4] = '\0';
  if (0 != strcmp(data_check, "RIFF")) {
    printf("RIFF error.\n");
    return 0;
  }
  fseek(fp, 4, SEEK_CUR);
  fread(data_check, 1, 4, fp);  // "WAVE"
  if (0 != strcmp(data_check, "WAVE")) {
    printf("WAVE error.\n");
    return 0;
  }
  fread(data_check, 1, 4, fp);  // "fmt "
  if (0 != strcmp(data_check, "fmt ")) {
    printf("fmt error.\n");
    return 0;
  }
  fread(data_check, 1, 4, fp);  // 1 0 0 0
  if (!(16 == data_check[0] && 0 == data_check[1] &&
      0 == data_check[2] && 0 == data_check[3])) {
    printf("fmt (2) error.\n");
    return 0;
  }
  fread(data_check, 1, 2, fp);  // 1 0
  if (!(1 == data_check[0] && 0 == data_check[1])) {
    printf("Format ID error.\n");
    return 0;
  }
  fread(data_check, 1, 2, fp);  // 1 0
  if (!(1 == data_check[0] && 0 == data_check[1])) {
    printf("This function cannot support stereo file\n");
    return 0;
  }
  return 1;
}